

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::generateRawUnitString_abi_cxx11_(precise_unit *un,uint64_t flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int power;
  int iVar7;
  int iVar8;
  precise_unit *in_RSI;
  string *in_RDI;
  int cnt;
  unit_data bu;
  string *val;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  unit_data local_20;
  undefined1 local_19;
  precise_unit *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_20 = precise_unit::base_units(local_10);
  detail::unit_data::meter(&local_20);
  iVar2 = addPosUnits((string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  detail::unit_data::kg(&local_20);
  iVar3 = addPosUnits((string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  detail::unit_data::second(&local_20);
  iVar4 = addPosUnits((string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  detail::unit_data::ampere(&local_20);
  iVar5 = addPosUnits((string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar2 + iVar3 + iVar4 + iVar5;
  detail::unit_data::kelvin(&local_20);
  iVar2 = addPosUnits((string *)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar6 + iVar2;
  detail::unit_data::mole(&local_20);
  iVar3 = addPosUnits((string *)CONCAT44(iVar5,iVar2),
                      (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar6 + iVar3;
  detail::unit_data::candela(&local_20);
  iVar4 = addPosUnits((string *)CONCAT44(iVar5,iVar2),
                      (char *)CONCAT44(iVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar6 + iVar4;
  detail::unit_data::count(&local_20);
  power = addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),
                      in_stack_ffffffffffffff94,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar6 + power;
  detail::unit_data::currency(&local_20);
  iVar7 = addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  detail::unit_data::radian(&local_20);
  iVar8 = addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar6 = iVar6 + iVar7 + iVar8;
  addUnitFlagStrings((precise_unit *)CONCAT44(iVar5,iVar2),(string *)CONCAT44(iVar3,iVar4));
  if (iVar6 == 1) {
    iVar6 = detail::unit_data::second(&local_20);
    if ((iVar6 == -1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x6bcc91), bVar1)) {
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(iVar5,iVar2),(char)((uint)iVar3 >> 0x18));
      detail::unit_data::meter(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::kg(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::second(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::ampere(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::kelvin(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::mole(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::candela(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::count(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::currency(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
      detail::unit_data::radian(&local_20);
      addPosUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                  CONCAT44(iVar8,in_stack_ffffffffffffff88));
    }
  }
  else if (1 < iVar6) {
    detail::unit_data::meter(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::kg(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::second(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::ampere(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::kelvin(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::mole(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::candela(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::count(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::currency(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
    detail::unit_data::radian(&local_20);
    addNegUnits((string *)CONCAT44(iVar5,iVar2),(char *)CONCAT44(iVar3,iVar4),power,
                CONCAT44(iVar8,in_stack_ffffffffffffff88));
  }
  return in_RDI;
}

Assistant:

static std::string
    generateRawUnitString(const precise_unit& un, std::uint64_t flags)
{
    std::string val;
    auto bu = un.base_units();
    int cnt{0};
    cnt += addPosUnits(val, "m", bu.meter(), flags);
    cnt += addPosUnits(val, "kg", bu.kg(), flags);
    cnt += addPosUnits(val, "s", bu.second(), flags);
    cnt += addPosUnits(val, "A", bu.ampere(), flags);
    cnt += addPosUnits(val, "K", bu.kelvin(), flags);
    cnt += addPosUnits(val, "mol", bu.mole(), flags);
    cnt += addPosUnits(val, "cd", bu.candela(), flags);
    cnt += addPosUnits(val, "item", bu.count(), flags);
    cnt += addPosUnits(val, "$", bu.currency(), flags);
    cnt += addPosUnits(val, "rad", bu.radian(), flags);
    addUnitFlagStrings(un, val);
    if (cnt == 1) {
        if (bu.second() == -1 && val.empty()) {
            // deal with 1/s  which is usually Hz
            addPosUnits(val, "Hz", 1, flags);
            return val;
        }
        val.push_back('/');
        addPosUnits(val, "m", -bu.meter(), flags);
        addPosUnits(val, "kg", -bu.kg(), flags);
        addPosUnits(val, "s", -bu.second(), flags);
        addPosUnits(val, "A", -bu.ampere(), flags);
        addPosUnits(val, "K", -bu.kelvin(), flags);
        addPosUnits(val, "mol", -bu.mole(), flags);
        addPosUnits(val, "cd", -bu.candela(), flags);
        addPosUnits(val, "item", -bu.count(), flags);
        addPosUnits(val, "$", -bu.currency(), flags);
        addPosUnits(val, "rad", -bu.radian(), flags);
    } else if (cnt > 1) {
        addNegUnits(val, "m", bu.meter(), flags);
        addNegUnits(val, "kg", bu.kg(), flags);
        addNegUnits(val, "s", bu.second(), flags);
        addNegUnits(val, "A", bu.ampere(), flags);
        addNegUnits(val, "K", bu.kelvin(), flags);
        addNegUnits(val, "mol", bu.mole(), flags);
        addNegUnits(val, "cd", bu.candela(), flags);
        addNegUnits(val, "item", bu.count(), flags);
        addNegUnits(val, "$", bu.currency(), flags);
        addNegUnits(val, "rad", bu.radian(), flags);
    }
    return val;
}